

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_utf8.c
# Opt level: O0

int u8_offset(char *str,int charnum)

{
  char *pcVar1;
  bool bVar2;
  char *local_20;
  char *string;
  int charnum_local;
  char *str_local;
  
  local_20 = str;
  string._4_4_ = charnum;
  while( true ) {
    bVar2 = false;
    if (0 < string._4_4_) {
      bVar2 = *local_20 != '\0';
    }
    if (!bVar2) break;
    pcVar1 = local_20 + 1;
    if ((((((int)*local_20 & 0x80U) != 0) && (((int)*pcVar1 & 0xc0U) == 0x80)) &&
        (pcVar1 = local_20 + 2, ((int)local_20[2] & 0xc0U) == 0x80)) &&
       (pcVar1 = local_20 + 3, ((int)local_20[3] & 0xc0U) == 0x80)) {
      pcVar1 = local_20 + 4;
    }
    local_20 = pcVar1;
    string._4_4_ = string._4_4_ + -1;
  }
  return (int)local_20 - (int)str;
}

Assistant:

int u8_offset(const char *str, int charnum)
{
    const char *string = str;

    while (charnum > 0 && *string != '\0') {
        if (*string++ & 0x80) {
            if (!isutf(*string)) {
                ++string;
                if (!isutf(*string)) {
                    ++string;
                    if (!isutf(*string)) {
                        ++string;
                    }
                }
            }
        }
        --charnum;
    }

    return (int)(string - str);
}